

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateIndexedObject(Validator *this,uint8_t *ptr,size_t length)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  byte bVar7;
  pointer __p;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar8;
  undefined1 *puVar9;
  int64_t iVar10;
  ValueLength length_00;
  ulong uVar11;
  __node_base_ptr p_Var12;
  Exception *pEVar13;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar14;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  char *msg;
  ulong uVar17;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar18;
  _Node_iterator_base<unsigned_long,_false> __it;
  bool bVar19;
  __node_base_ptr p_Var20;
  ulong uVar21;
  long lVar22;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *ptr_00;
  long lVar23;
  ulong *puVar24;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar25;
  unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  offsetSet;
  Slice key;
  ValueLength offset;
  ValueLength tableBuf [16];
  undefined1 *local_108;
  ulong local_f0;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  local_e8;
  long local_e0;
  Validator *local_d8;
  _Head_base<0UL,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_*,_false>
  local_d0;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_c8;
  long local_c0;
  undefined1 local_b8 [136];
  
  bVar2 = *ptr;
  lVar23 = ((ulong)((ulong)bVar2 < 0xf) << 2 | 0xfffffffffffffff1) + (ulong)bVar2;
  bVar7 = (byte)lVar23;
  lVar22 = 1L << (bVar7 & 0x3f);
  local_d8 = this;
  validateBufferLength(this,(2L << (bVar7 & 0x3f)) + 2,length,true);
  puVar24 = (ulong *)(ptr + 1);
  lVar1 = lVar22 + -1;
  switch(lVar1) {
  case 0:
    uVar17 = (ulong)(byte)*puVar24;
    break;
  case 1:
    uVar17 = (ulong)*(ushort *)(ptr + 1);
    break;
  case 2:
    uVar11 = (ulong)((uint)ptr[2] << 8 | (uint)ptr[3] << 0x10);
    uVar17 = (ulong)ptr[1];
    goto LAB_0010c8af;
  case 3:
    uVar17 = (ulong)*(uint *)(ptr + 1);
    break;
  case 4:
    uVar3 = (uint)*puVar24;
    uVar17 = (ulong)ptr[5];
    goto LAB_0010c892;
  case 5:
    uVar3 = (uint)*puVar24;
    uVar17 = (ulong)*(ushort *)(ptr + 5);
LAB_0010c892:
    uVar17 = uVar17 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar11 = (ulong)*(uint3 *)(ptr + 5) << 0x20;
    uVar17 = (ulong)(uint)*puVar24;
LAB_0010c8af:
    uVar17 = uVar17 | uVar11;
    break;
  case 7:
    uVar17 = *puVar24;
    break;
  default:
    uVar17 = 0;
  }
  local_e0 = lVar23;
  if (length < uVar17) {
    pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object length is out of bounds";
    goto LAB_0010d0b0;
  }
  if ((bVar2 != 0x12) && (bVar2 != 0xe)) {
    puVar24 = (ulong *)((long)puVar24 + lVar22);
    switch(lVar1) {
    case 0:
      local_f0 = (ulong)(byte)*puVar24;
      break;
    case 1:
      local_f0 = (ulong)(ushort)*puVar24;
      break;
    case 2:
      uVar11 = (ulong)((uint)*(byte *)((long)puVar24 + 1) << 8 |
                      (uint)*(byte *)((long)puVar24 + 2) << 0x10);
      local_f0 = (ulong)(byte)*puVar24;
      goto LAB_0010ca12;
    case 3:
      local_f0 = (ulong)(uint)*puVar24;
      break;
    case 4:
      uVar3 = (uint)*puVar24;
      uVar11 = (ulong)*(byte *)((long)puVar24 + 4);
      goto LAB_0010c9f6;
    case 5:
      uVar3 = (uint)*puVar24;
      uVar11 = (ulong)*(ushort *)((long)puVar24 + 4);
LAB_0010c9f6:
      local_f0 = uVar11 << 0x20 | (ulong)uVar3;
      break;
    case 6:
      uVar11 = (ulong)*(uint3 *)((long)puVar24 + 4) << 0x20;
      local_f0 = (ulong)(uint)*puVar24;
LAB_0010ca12:
      local_f0 = local_f0 | uVar11;
      break;
    case 7:
      local_f0 = *puVar24;
      break;
    default:
      local_f0 = 0;
    }
    if (local_f0 == 0) goto LAB_0010d039;
    puVar8 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)((long)puVar24 + lVar22);
    puVar14 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)&(puVar8->_M_h)._M_bucket_count + (-2L << (bVar7 & 0x3f)));
    puVar25 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)(ptr + uVar17);
    ptr_00 = puVar8;
    puVar18 = puVar14;
    if (puVar25 < puVar14) {
      puVar18 = puVar25;
    }
    for (; (ptr_00 < puVar18 && (*(byte *)&(ptr_00->_M_h)._M_buckets == 0));
        ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)((long)&(ptr_00->_M_h)._M_buckets + 1)) {
    }
    if (ptr_00 != puVar14 && ptr_00 != puVar8) {
      pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object padding is invalid";
      goto LAB_0010d0b0;
    }
    puVar25 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar25 - (local_f0 << (bVar7 & 0x3f)));
    if (((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)(ptr + lVar22 * 2) <= puVar25) && (ptr_00 <= puVar25)) {
      lVar22 = -lVar22;
      goto LAB_0010cab7;
    }
    goto LAB_0010d04f;
  }
  ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)(ptr + uVar17);
  puVar24 = (ulong *)((long)ptr_00 - lVar22);
  switch(lVar1) {
  case 0:
    local_f0 = (ulong)(byte)*puVar24;
    break;
  case 1:
    local_f0 = (ulong)(ushort)*puVar24;
    break;
  case 2:
    uVar17 = (ulong)((uint)*(byte *)((long)puVar24 + 1) << 8 |
                    (uint)*(byte *)((long)puVar24 + 2) << 0x10);
    local_f0 = (ulong)(byte)*puVar24;
    goto LAB_0010c97e;
  case 3:
    local_f0 = (ulong)(uint)*puVar24;
    break;
  case 4:
    uVar3 = (uint)*puVar24;
    uVar17 = (ulong)*(byte *)((long)puVar24 + 4);
    goto LAB_0010c95f;
  case 5:
    uVar3 = (uint)*puVar24;
    uVar17 = (ulong)*(ushort *)((long)puVar24 + 4);
LAB_0010c95f:
    local_f0 = uVar17 << 0x20 | (ulong)uVar3;
    break;
  case 6:
    uVar17 = (ulong)*(uint3 *)((long)puVar24 + 4) << 0x20;
    local_f0 = (ulong)(uint)*puVar24;
LAB_0010c97e:
    local_f0 = local_f0 | uVar17;
    break;
  case 7:
    local_f0 = *puVar24;
    break;
  default:
    local_f0 = 0;
  }
  if (local_f0 == 0) {
LAB_0010d039:
    pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object nrItems value is invalid";
  }
  else {
    puVar25 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)((long)puVar24 - (local_f0 << (bVar7 & 0x3f)));
    if ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
         *)(ptr + lVar22) <= puVar25) {
      lVar22 = lVar22 * -2;
LAB_0010cab7:
      if (puVar25 <=
          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)(ptr + lVar22 + length)) {
        local_e8._M_head_impl =
             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)0x0;
        puVar9 = local_b8;
        if (local_f0 < 0x11) {
          local_108 = (undefined1 *)0x0;
        }
        else if (local_f0 < 0x81) {
          puVar9 = (undefined1 *)operator_new__(local_f0 * 8);
          local_108 = puVar9;
        }
        else {
          local_e8._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)operator_new(0x38);
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_buckets = (__buckets_ptr)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_bucket_count = 0;
          *(undefined8 *)
           &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)local_e8._M_head_impl)->_M_rehash_policy = 0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_e8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_e8._M_head_impl)->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_element_count = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_buckets =
               &((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_e8._M_head_impl)->_M_single_bucket;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_bucket_count = 1;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_e8._M_head_impl)->_M_rehash_policy)._M_max_load_factor = 1.0;
          (((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)local_e8._M_head_impl)->_M_rehash_policy)._M_next_resize = 0;
          ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)local_e8._M_head_impl)->_M_single_bucket = (__node_base_ptr)0x0;
          local_108 = (undefined1 *)0x0;
          local_d0._M_head_impl =
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)0x0;
          std::
          unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                         *)&local_d0);
        }
        uVar17 = 0;
        for (; ptr_00 < puVar25;
            ptr_00 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)((long)&(ptr_00->_M_h)._M_buckets + uVar11 + length_00)) {
          validatePart(local_d8,(uint8_t *)ptr_00,(long)puVar25 - (long)ptr_00,true);
          bVar2 = *(byte *)&(ptr_00->_M_h)._M_buckets;
          local_d0._M_head_impl = ptr_00;
          if (0x7f < (ulong)bVar2 - 0x40) {
            if ((bVar2 & 0xf0) == 0x30) {
              iVar10 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                       getSmallInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                    *)&local_d0);
              if (iVar10 < 1) {
LAB_0010cfea:
                pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
                Exception::Exception(pEVar13,ValidatorInvalidLength,"Invalid object key type");
                __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
              }
            }
            else if ((bVar2 & 0xf8) != 0x28) goto LAB_0010cfea;
          }
          length_00 = (ValueLength)"\x01\x01"[*(byte *)&((local_d0._M_head_impl)->_M_h)._M_buckets];
          if (length_00 == 0) {
            length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                        byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                         *)&local_d0,(uint8_t *)local_d0._M_head_impl);
          }
          if (((ulong)bVar2 - 0x40 < 0x80) && (local_d8->options->validateUtf8Strings == true)) {
            validatePart(local_d8,(uint8_t *)ptr_00,length_00,true);
          }
          puVar18 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)((long)&(ptr_00->_M_h)._M_buckets + length_00);
          if (puVar25 <= puVar18) {
            pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar13,ValidatorInvalidLength,"Object value leaking into index table");
            __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
          }
          validatePart(local_d8,(uint8_t *)puVar18,(long)puVar25 - (long)puVar18,true);
          local_c0 = (long)ptr_00 - (long)ptr;
          if (local_f0 < 0x81) {
            *(long *)(puVar9 + uVar17 * 8) = local_c0;
          }
          else {
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::_M_emplace<unsigned_long&>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_e8._M_head_impl,&local_c0);
          }
          uVar11 = (ulong)"\x01\x01"[*(byte *)&(puVar18->_M_h)._M_buckets];
          local_c8 = puVar18;
          if (uVar11 == 0) {
            uVar11 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                     byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                      *)&local_c8,(uint8_t *)puVar18);
          }
          uVar17 = uVar17 + 1;
          if (local_f0 < uVar17) {
            pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception
                      (pEVar13,ValidatorInvalidLength,
                       "Object value has more key/value pairs than announced");
            __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
          }
        }
        if (uVar17 < local_f0) {
          pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception
                    (pEVar13,ValidatorInvalidLength,"Object has fewer items than in index");
          __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
        }
        bVar2 = (byte)local_e0;
        if (local_f0 < 0x81) {
          lVar22 = 0;
          do {
            lVar23 = lVar22 << (bVar2 & 0x3f);
            switch(lVar1) {
            case 0:
              uVar17 = (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              break;
            case 1:
              uVar17 = (ulong)*(ushort *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              break;
            case 2:
              uVar11 = (ulong)((uint)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23 + 1) << 8
                              | (uint)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23 + 2) <<
                                0x10);
              uVar17 = (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              goto LAB_0010cd5c;
            case 3:
              uVar17 = (ulong)*(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              break;
            case 4:
              uVar3 = *(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              uVar17 = (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23 + 4);
              goto LAB_0010cd3b;
            case 5:
              uVar3 = *(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              uVar17 = (ulong)*(ushort *)((long)&(puVar25->_M_h)._M_buckets + lVar23 + 4);
LAB_0010cd3b:
              uVar11 = (ulong)uVar3;
              uVar17 = uVar17 << 0x20;
              goto LAB_0010cd5c;
            case 6:
              uVar11 = (ulong)CONCAT12(*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar23 + 6),
                                       *(undefined2 *)
                                        ((long)&(puVar25->_M_h)._M_buckets + lVar23 + 4)) << 0x20;
              uVar17 = (ulong)*(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
LAB_0010cd5c:
              uVar17 = uVar17 | uVar11;
              break;
            case 7:
              uVar17 = *(ulong *)((long)&(puVar25->_M_h)._M_buckets + lVar23);
              break;
            default:
              uVar17 = 0;
            }
            uVar11 = 0;
            uVar16 = local_f0;
            do {
              bVar19 = false;
              if (uVar16 <= uVar11) goto LAB_0010cd94;
              uVar21 = uVar16 + uVar11 >> 1;
              uVar4 = *(ulong *)(puVar9 + uVar21 * 8);
              if (uVar4 < uVar17) {
                uVar11 = uVar21 + 1;
              }
              if (uVar4 <= uVar17) {
                uVar21 = uVar16;
              }
              uVar16 = uVar21;
            } while (uVar17 != uVar4);
            bVar19 = true;
LAB_0010cd94:
            if (!bVar19) {
              pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar13,ValidatorInvalidLength,"Object has invalid index offset")
              ;
              __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != local_f0 + (local_f0 == 0));
        }
        else {
          uVar17 = 0;
          do {
            lVar22 = uVar17 << (bVar2 & 0x3f);
            switch(lVar1) {
            case 0:
              p_Var15 = (_Hash_node_base *)
                        (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              break;
            case 1:
              p_Var15 = (_Hash_node_base *)
                        (ulong)*(ushort *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              break;
            case 2:
              uVar16 = (ulong)((uint)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22 + 1) << 8
                              | (uint)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22 + 2) <<
                                0x10);
              uVar11 = (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              goto LAB_0010ce47;
            case 3:
              p_Var15 = (_Hash_node_base *)
                        (ulong)*(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              break;
            case 4:
              uVar3 = *(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              uVar11 = (ulong)*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22 + 4);
              goto LAB_0010ce28;
            case 5:
              uVar3 = *(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              uVar11 = (ulong)*(ushort *)((long)&(puVar25->_M_h)._M_buckets + lVar22 + 4);
LAB_0010ce28:
              uVar16 = (ulong)uVar3;
              uVar11 = uVar11 << 0x20;
              goto LAB_0010ce47;
            case 6:
              uVar16 = (ulong)CONCAT12(*(byte *)((long)&(puVar25->_M_h)._M_buckets + lVar22 + 6),
                                       *(undefined2 *)
                                        ((long)&(puVar25->_M_h)._M_buckets + lVar22 + 4)) << 0x20;
              uVar11 = (ulong)*(uint *)((long)&(puVar25->_M_h)._M_buckets + lVar22);
LAB_0010ce47:
              p_Var15 = (_Hash_node_base *)(uVar11 | uVar16);
              break;
            case 7:
              p_Var15 = *(_Hash_node_base **)((long)&(puVar25->_M_h)._M_buckets + lVar22);
              break;
            default:
              p_Var15 = (_Hash_node_base *)0x0;
            }
            uVar11 = ((local_e8._M_head_impl)->_M_h)._M_bucket_count;
            uVar16 = (ulong)p_Var15 % uVar11;
            p_Var5 = ((local_e8._M_head_impl)->_M_h)._M_buckets[uVar16];
            p_Var12 = (__node_base_ptr)0x0;
            if ((p_Var5 != (__node_base_ptr)0x0) &&
               (p_Var12 = p_Var5, p_Var20 = p_Var5->_M_nxt, p_Var15 != p_Var5->_M_nxt[1]._M_nxt)) {
              while (p_Var6 = p_Var20->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
                p_Var12 = (__node_base_ptr)0x0;
                if (((ulong)p_Var6[1]._M_nxt % uVar11 != uVar16) ||
                   (p_Var12 = p_Var20, p_Var20 = p_Var6, p_Var15 == p_Var6[1]._M_nxt))
                goto LAB_0010ceac;
              }
              p_Var12 = (__node_base_ptr)0x0;
            }
LAB_0010ceac:
            if (p_Var12 == (__node_base_ptr)0x0) {
              __it._M_cur = (__node_type *)0x0;
            }
            else {
              __it._M_cur = (__node_type *)p_Var12->_M_nxt;
            }
            if (__it._M_cur == (__node_type *)0x0) {
              pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
              Exception::Exception(pEVar13,ValidatorInvalidLength,"Object has invalid index offset")
              ;
              __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::erase(&(local_e8._M_head_impl)->_M_h,(const_iterator)__it._M_cur);
            uVar17 = uVar17 + 1;
          } while (uVar17 != local_f0);
        }
        std::
        unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ::~unique_ptr((unique_ptr<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::default_delete<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                       *)&local_e8);
        if (local_108 != (undefined1 *)0x0) {
          operator_delete__(local_108);
        }
        return;
      }
    }
LAB_0010d04f:
    pEVar13 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Object index table is out of bounds";
  }
LAB_0010d0b0:
  Exception::Exception(pEVar13,ValidatorInvalidLength,msg);
  __cxa_throw(pEVar13,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateIndexedObject(uint8_t const* ptr, std::size_t length) {
  // Object with index table, with 1-8 bytes lengths
  uint8_t head = *ptr;
  ValueLength byteSizeLength;
  if (VELOCYPACK_UNLIKELY(head >= 0x0f)) {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0fU);
  } else {
    byteSizeLength = 1ULL << (static_cast<ValueLength>(head) - 0x0bU);
  }
  VELOCYPACK_ASSERT(byteSizeLength > 0);
  validateBufferLength(1 + byteSizeLength + byteSizeLength + 1, length, true);
  ValueLength const byteSize =
      readIntegerNonEmpty<ValueLength>(ptr + 1, byteSizeLength);

  if (byteSize > length) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length is out of bounds");
  }

  ValueLength nrItems;
  uint8_t const* indexTable;
  uint8_t const* firstMember;

  if (head == 0x0eU || head == 0x12U) {
    // byte length = 8
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + byteSize - byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    indexTable = ptr + byteSize - byteSizeLength - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength ||
        indexTable > ptr + length - byteSizeLength - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = ptr + byteSize;
  } else {
    // byte length = 1, 2 or 4
    nrItems = readIntegerNonEmpty<ValueLength>(ptr + 1 + byteSizeLength,
                                               byteSizeLength);

    if (nrItems == 0) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object nrItems value is invalid");
    }

    // look up first member
    uint8_t const* p = ptr + 1 + byteSizeLength + byteSizeLength;
    uint8_t const* e = p + (8 - byteSizeLength - byteSizeLength);
    if (e > ptr + byteSize) {
      e = ptr + byteSize;
    }
    while (p < e && *p == '\x00') {
      ++p;
    }

    // check if padding is correct
    if (p != ptr + 1 + byteSizeLength + byteSizeLength &&
        p != ptr + 1 + byteSizeLength + byteSizeLength +
                 (8 - byteSizeLength - byteSizeLength)) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object padding is invalid");
    }

    indexTable = ptr + byteSize - (nrItems * byteSizeLength);
    if (indexTable < ptr + byteSizeLength + byteSizeLength || indexTable < p ||
        indexTable > ptr + length - byteSizeLength) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object index table is out of bounds");
    }

    firstMember = p;
  }

  VELOCYPACK_ASSERT(nrItems > 0);

  ValueLength tableBuf[16];  // Fixed space to save offsets found sequentially
  ValueLength* table = tableBuf;
  std::unique_ptr<ValueLength[]> tableGuard;
  std::unique_ptr<std::unordered_set<ValueLength>> offsetSet;
  if (nrItems > 16) {
    if (nrItems <= 128) {
      table = new ValueLength[nrItems];  // throws if bad_alloc
      tableGuard.reset(table);           // for automatic deletion
    } else {
      // if we have even more items, we directly create an unordered_set
      offsetSet = std::make_unique<std::unordered_set<ValueLength>>();
    }
  }
  ValueLength actualNrItems = 0;
  uint8_t const* member = firstMember;
  while (member < indexTable) {
    validatePart(member, indexTable - member, true);

    Slice key(member);
    bool const isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }

    ValueLength const keySize = key.byteSize();
    if (isString && options->validateUtf8Strings) {
      validatePart(member, keySize, true);
    }

    uint8_t const* value = member + keySize;
    if (value >= indexTable) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value leaking into index table");
    }
    validatePart(value, indexTable - value, true);

    ValueLength offset = static_cast<ValueLength>(member - ptr);
    if (nrItems <= 128) {
      table[actualNrItems] = offset;
    } else {
      offsetSet->emplace(offset);
    }

    member += keySize + Slice(value).byteSize();
    ++actualNrItems;

    if (actualNrItems > nrItems) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object value has more key/value pairs than announced");
    }
  }

  if (actualNrItems < nrItems) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has fewer items than in index");
  }

  // Finally verify each offset in the index:
  if (nrItems <= 128) {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      // Binary search in sorted index list:
      ValueLength low = 0;
      ValueLength high = nrItems;
      bool found = false;
      while (low < high) {
        ValueLength mid = (low + high) / 2;
        if (offset == table[mid]) {
          found = true;
          break;
        } else if (offset < table[mid]) {
          high = mid;
        } else {  // offset > table[mid]
          low = mid + 1;
        }
      }
      if (!found) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
    }
  } else {
    for (ValueLength pos = 0; pos < nrItems; ++pos) {
      ValueLength offset = readIntegerNonEmpty<ValueLength>(
          indexTable + pos * byteSizeLength, byteSizeLength);
      auto i = offsetSet->find(offset);
      if (i == offsetSet->end()) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Object has invalid index offset");
      }
      offsetSet->erase(i);
    }
  }
}